

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

int __thiscall PFloat::GetValueInt(PFloat *this,void *addr)

{
  int32_t iVar1;
  real64 val;
  void *addr_local;
  PFloat *this_local;
  
  (*(this->super_PBasicType).super_PType.super_PTypeBase.super_DObject._vptr_DObject[0x12])
            (this,addr);
  iVar1 = xs_ToInt(val,-0.499999985);
  return iVar1;
}

Assistant:

int PFloat::GetValueInt(void *addr) const
{
	return xs_ToInt(GetValueFloat(addr));
}